

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> __thiscall
duckdb::DropInfo::Deserialize(DropInfo *this,Deserializer *deserializer)

{
  DropInfo *this_00;
  pointer pDVar1;
  _Head_base<0UL,_duckdb::DropInfo_*,_false> local_20;
  
  this_00 = (DropInfo *)operator_new(0x80);
  DropInfo(this_00);
  local_20._M_head_impl = this_00;
  pDVar1 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *)
                      &local_20);
  Deserializer::ReadProperty<duckdb::CatalogType>
            (deserializer,200,"type",&(pDVar1->super_ParseInfo).field_0x9);
  pDVar1 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *)
                      &local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0xc9,"catalog",&pDVar1->catalog);
  pDVar1 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *)
                      &local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0xca,"schema",&pDVar1->schema);
  pDVar1 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *)
                      &local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0xcb,"name",&pDVar1->name);
  pDVar1 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *)
                      &local_20);
  Deserializer::ReadProperty<duckdb::OnEntryNotFound>
            (deserializer,0xcc,"if_not_found",&pDVar1->if_not_found);
  pDVar1 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *)
                      &local_20);
  Deserializer::ReadPropertyWithDefault<bool>(deserializer,0xcd,"cascade",&pDVar1->cascade);
  pDVar1 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *)
                      &local_20);
  Deserializer::ReadPropertyWithDefault<bool>
            (deserializer,0xce,"allow_drop_internal",&pDVar1->allow_drop_internal);
  pDVar1 = unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DropInfo,_std::default_delete<duckdb::DropInfo>,_true> *)
                      &local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ExtraDropInfo,std::default_delete<duckdb::ExtraDropInfo>,true>>
            (deserializer,0xcf,"extra_drop_info",&pDVar1->extra_drop_info);
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)this;
}

Assistant:

unique_ptr<ParseInfo> DropInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<DropInfo>(new DropInfo());
	deserializer.ReadProperty<CatalogType>(200, "type", result->type);
	deserializer.ReadPropertyWithDefault<string>(201, "catalog", result->catalog);
	deserializer.ReadPropertyWithDefault<string>(202, "schema", result->schema);
	deserializer.ReadPropertyWithDefault<string>(203, "name", result->name);
	deserializer.ReadProperty<OnEntryNotFound>(204, "if_not_found", result->if_not_found);
	deserializer.ReadPropertyWithDefault<bool>(205, "cascade", result->cascade);
	deserializer.ReadPropertyWithDefault<bool>(206, "allow_drop_internal", result->allow_drop_internal);
	deserializer.ReadPropertyWithDefault<unique_ptr<ExtraDropInfo>>(207, "extra_drop_info", result->extra_drop_info);
	return std::move(result);
}